

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Vec_Int_t * Wlc_NtkCleanObjects(Wlc_Ntk_t *p,Vec_Int_t *vObjs)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  long lVar5;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 0x10;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  p_00->pArray = piVar4;
  Wlc_NtkSetRefs(p);
  if (0 < vObjs->nSize) {
    lVar5 = 0;
    do {
      iVar1 = vObjs->pArray[lVar5];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pWVar2 = p->pObjs;
      iVar3 = Wlc_ObjCheckIsEmpty_rec(p,pWVar2 + iVar1);
      if (iVar3 == 0) {
        Vec_IntPush(p_00,(int)((ulong)((long)(pWVar2 + iVar1) - (long)p->pObjs) >> 3) * -0x55555555)
        ;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vObjs->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCleanObjects( Wlc_Ntk_t * p, Vec_Int_t * vObjs )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vMemObjs = Vec_IntAlloc( 10 );
    Wlc_NtkSetRefs( p );
    Wlc_NtkForEachObjVec( vObjs, p, pObj, i )
    {
        //printf( "Considering %d (%s)\n", Wlc_ObjId(p, pObj), Wlc_ObjName(p, Wlc_ObjId(p, pObj)) );
        if ( !Wlc_ObjCheckIsEmpty_rec(p, pObj) )
            Vec_IntPush( vMemObjs, Wlc_ObjId(p, pObj) );
    }
    return vMemObjs;
}